

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void shape_lore_append_skills(textblock *tb,player_shape *s)

{
  uint uVar1;
  char *pcVar2;
  wchar_t local_2c;
  wchar_t local_28;
  wchar_t i;
  wchar_t n;
  wchar_t nmax;
  char **msgs;
  player_shape *s_local;
  textblock *tb_local;
  
  _n = (char **)0x0;
  i = L'\0';
  local_28 = L'\0';
  msgs = (char **)s;
  s_local = (player_shape *)tb;
  for (local_2c = L'\0'; local_2c < L'\n'; local_2c = local_2c + L'\x01') {
    if (*(int *)((long)msgs + (long)local_2c * 4 + 0x20) != 0) {
      uVar1 = *(uint *)((long)msgs + (long)local_2c * 4 + 0x20);
      pcVar2 = skill_index_to_name(local_2c);
      pcVar2 = format("%+d to %s",(ulong)uVar1,pcVar2);
      shape_lore_helper_append_to_list(pcVar2,(char ***)&n,&i,&local_28);
    }
  }
  if (L'\0' < local_28) {
    textblock_append((textblock *)s_local,"Adds");
    shape_lore_append_list((textblock *)s_local,_n,local_28);
    textblock_append((textblock *)s_local,".\n");
    for (local_2c = L'\0'; local_2c < local_28; local_2c = local_2c + L'\x01') {
      string_free(_n[local_2c]);
    }
  }
  mem_free(_n);
  return;
}

Assistant:

static void shape_lore_append_skills(textblock *tb,
	const struct player_shape *s)
{
	const char **msgs = NULL;
	int nmax = 0, n = 0;
	int i;

	for (i = 0; i < SKILL_MAX; ++i) {
		if (s->skills[i] != 0) {
			shape_lore_helper_append_to_list(
				format("%+d to %s", s->skills[i],
					skill_index_to_name(i)),
				&msgs, &nmax, &n);
		}
	}

	if (n > 0) {
		textblock_append(tb, "Adds");
		shape_lore_append_list(tb, msgs, n);
		textblock_append(tb, ".\n");
		for (i = 0; i < n; ++i) {
			string_free((char*) msgs[i]);
		}
	}

	mem_free(msgs);
}